

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCylinder *geom,uint32_t indent,
          bool closing_brace)

{
  TypedAttributeWithFallback<tinyusdz::Axis> *this_00;
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  Axis *pAVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint indent_00;
  string axis;
  stringstream ss;
  allocator local_20d;
  uint32_t local_20c;
  string local_208;
  pprint *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_20c = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = ::std::operator<<(poVar3," Cylinder \"");
  poVar3 = ::std::operator<<(poVar3,(string *)(this + 0xa78));
  ::std::operator<<(poVar3,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_208,this + 0x1a10,(PrimMeta *)(ulong)((int)geom + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n_01);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_00 = (int)geom + 1;
  local_1e8 = (pprint *)((ulong)geom & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n_02);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::operator<<(poVar3,"{\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"radius",&local_20d);
  print_typed_attr<double>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x2100)
             ,&local_1d8,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"height",&local_20d);
  print_typed_attr<double>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x1e68)
             ,&local_1d8,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  this_00 = (TypedAttributeWithFallback<tinyusdz::Axis> *)(this + 0x2398);
  bVar2 = TypedAttributeWithFallback<tinyusdz::Axis>::authored(this_00);
  if (bVar2) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    pAVar4 = TypedAttributeWithFallback<tinyusdz::Axis>::get_value(this_00);
    if (*pAVar4 != X) {
      TypedAttributeWithFallback<tinyusdz::Axis>::get_value(this_00);
    }
    ::std::__cxx11::string::assign((char *)&local_208);
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent_00,n_03);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_1d8);
    poVar3 = ::std::operator<<(poVar3,"uniform token axis = ");
    poVar3 = ::std::operator<<(poVar3,(string *)&local_208);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  print_gprim_predefined<tinyusdz::GeomCylinder>(&local_208,(GeomCylinder *)this,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_20c != '\0') {
    pprint::Indent_abi_cxx11_(&local_208,local_1e8,n_04);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string to_string(const GeomCylinder &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " Cylinder \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.radius, "radius", indent + 1);
  ss << print_typed_attr(geom.height, "height", indent + 1);

  if (geom.axis.authored()) {
    std::string axis;
    if (geom.axis.get_value() == Axis::X) {
      axis = "\"X\"";
    } else if (geom.axis.get_value() == Axis::Y) {
      axis = "\"Y\"";
    } else {
      axis = "\"Z\"";
    }
    ss << pprint::Indent(indent + 1) << "uniform token axis = " << axis << "\n";
  }

  ss << print_gprim_predefined(geom, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}